

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_fixup.c
# Opt level: O0

void test_write_disk_fixup(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *a;
  archive_entry *paVar3;
  int r;
  archive_entry *ae;
  archive *ad;
  
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                   ,L'(');
    test_skipping("Symlinks not supported");
  }
  else {
    a = archive_write_disk_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                     ,L'-',(uint)(a != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                     (void *)0x0);
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'2',"file",L'ƀ',L'\xffffffff',"a");
    assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                       ,L'7',"dir",L'ǀ');
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                     ,L'>',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"dir1/");
    archive_entry_set_mode(paVar3,0x416d);
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'A',0,"0",(long)iVar2,"archive_write_header(ad, ae)",a);
    iVar2 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'B',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    archive_entry_free(paVar3);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                     ,L'F',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"dir2/");
    archive_entry_set_mode(paVar3,0x416d);
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'I',0,"0",(long)iVar2,"archive_write_header(ad, ae)",a);
    iVar2 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'J',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    archive_entry_free(paVar3);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                     ,L'N',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"dir1");
    archive_entry_set_mode(paVar3,0xa1ff);
    archive_entry_set_size(paVar3,0);
    archive_entry_copy_symlink(paVar3,"dir");
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'S',0,"0",(long)iVar2,"r = archive_write_header(ad, ae)",a);
    if (-0x15 < iVar2) {
      iVar2 = archive_write_finish_entry(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                          ,L'U',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    }
    archive_entry_free(paVar3);
    paVar3 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                     ,L'Y',(uint)(paVar3 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname(paVar3,"dir2");
    archive_entry_set_mode(paVar3,0xa1ff);
    archive_entry_set_size(paVar3,0);
    archive_entry_copy_symlink(paVar3,"file");
    iVar2 = archive_write_header(a,paVar3);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'^',0,"0",(long)iVar2,"r = archive_write_header(ad, ae)",a);
    if (-0x15 < iVar2) {
      iVar2 = archive_write_finish_entry(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                          ,L'`',0,"0",(long)iVar2,"archive_write_finish_entry(ad)",a);
    }
    archive_entry_free(paVar3);
    iVar2 = archive_write_free(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'c',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(ad)",(void *)0x0);
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
               ,L'f',"dir1","dir",L'\0');
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
               ,L'g',"dir2","file",L'\0');
    assertion_file_mode("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'h',"dir",L'ǀ');
    assertion_file_mode("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_fixup.c"
                        ,L'i',"file",L'ƀ');
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_fixup)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	skipping("Skipping test on Windows");
#else
	struct archive *ad;
	struct archive_entry *ae;
	int r;

	if (!canSymlink()) {
		skipping("Symlinks not supported");
		return;
	}

	/* Write entries to disk. */
	assert((ad = archive_write_disk_new()) != NULL);

	/*
	 * Create a file
	 */
	assertMakeFile("file", 0600, "a");

	/*
	 * Create a directory
	 */
	assertMakeDir("dir", 0700);

	/*
	 * Create a directory and a symlink with the same name
	 */

	/* Directory: dir1 */
        assert((ae = archive_entry_new()) != NULL);
        archive_entry_copy_pathname(ae, "dir1/");
        archive_entry_set_mode(ae, AE_IFDIR | 0555);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
        archive_entry_free(ae);

	/* Directory: dir2 */
        assert((ae = archive_entry_new()) != NULL);
        archive_entry_copy_pathname(ae, "dir2/");
        archive_entry_set_mode(ae, AE_IFDIR | 0555);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
        archive_entry_free(ae);

	/* Symbolic Link: dir1 -> dir */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir1");
	archive_entry_set_mode(ae, AE_IFLNK | 0777);
	archive_entry_set_size(ae, 0);
	archive_entry_copy_symlink(ae, "dir");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN)
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Symbolic Link: dir2 -> file */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "dir2");
	archive_entry_set_mode(ae, AE_IFLNK | 0777);
	archive_entry_set_size(ae, 0);
	archive_entry_copy_symlink(ae, "file");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN)
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	assertEqualInt(ARCHIVE_OK, archive_write_free(ad));

	/* Test the entries on disk. */
	assertIsSymlink("dir1", "dir", 0);
	assertIsSymlink("dir2", "file", 0);
	assertFileMode("dir", 0700);
	assertFileMode("file", 0600);
#endif
}